

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

Vec_Int_t * Ivy_ManDfsSeq(Ivy_Man_t *p,Vec_Int_t **pvLatches)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vNodes_00;
  Ivy_Obj_t *pIVar2;
  bool bVar3;
  int local_34;
  Ivy_Obj_t *pIStack_30;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Int_t *vLatches;
  Vec_Int_t *vNodes;
  Vec_Int_t **pvLatches_local;
  Ivy_Man_t *p_local;
  
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_34) {
      iVar1 = Ivy_ManLatchNum(p);
      p_00 = Vec_IntAlloc(iVar1);
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
        pIStack_30 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
        if ((pIStack_30 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsLatch(pIStack_30), iVar1 != 0)) {
          Vec_IntPush(p_00,pIStack_30->Id);
        }
      }
      iVar1 = Ivy_ManNodeNum(p);
      vNodes_00 = Vec_IntAlloc(iVar1);
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vPos), local_34 < iVar1; local_34 = local_34 + 1) {
        pIStack_30 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,local_34);
        pIVar2 = Ivy_ObjFanin0(pIStack_30);
        Ivy_ManDfs_rec(p,pIVar2,vNodes_00);
      }
      local_34 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p_00);
        bVar3 = false;
        if (local_34 < iVar1) {
          iVar1 = Vec_IntEntry(p_00,local_34);
          pIStack_30 = Ivy_ManObj(p,iVar1);
          bVar3 = pIStack_30 != (Ivy_Obj_t *)0x0;
        }
        if (!bVar3) break;
        pIVar2 = Ivy_ObjFanin0(pIStack_30);
        Ivy_ManDfs_rec(p,pIVar2,vNodes_00);
        local_34 = local_34 + 1;
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
        pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
        if (pIVar2 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjClearMarkA(pIVar2);
        }
      }
      if (pvLatches == (Vec_Int_t **)0x0) {
        Vec_IntFree(p_00);
      }
      else {
        *pvLatches = p_00;
      }
      return vNodes_00;
    }
    pIStack_30 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pIStack_30 != (Ivy_Obj_t *)0x0) &&
       (((*(uint *)&pIStack_30->field_0x8 >> 4 & 1) != 0 ||
        ((*(uint *)&pIStack_30->field_0x8 >> 5 & 1) != 0)))) break;
    local_34 = local_34 + 1;
  }
  __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDfs.c"
                ,0x81,"Vec_Int_t *Ivy_ManDfsSeq(Ivy_Man_t *, Vec_Int_t **)");
}

Assistant:

Vec_Int_t * Ivy_ManDfsSeq( Ivy_Man_t * p, Vec_Int_t ** pvLatches )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Obj_t * pObj;
    int i;
//    assert( Ivy_ManLatchNum(p) > 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the latches
    vLatches = Vec_IntAlloc( Ivy_ManLatchNum(p) );
    Ivy_ManForEachLatch( p, pObj, i )
        Vec_IntPush( vLatches, pObj->Id );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
//    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );

// temporary!!!

    if ( pvLatches == NULL )
        Vec_IntFree( vLatches );
    else
        *pvLatches = vLatches;
    return vNodes;
}